

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O0

int duckdb::History::Save(char *filename)

{
  __mode_t __mask;
  FILE *__stream;
  char *in_RDI;
  idx_t j;
  FILE *fp;
  mode_t old_umask;
  ulong local_28;
  int local_4;
  
  __mask = umask(0x7f);
  __stream = fopen(in_RDI,"w");
  umask(__mask);
  if (__stream == (FILE *)0x0) {
    local_4 = -1;
  }
  else {
    chmod(in_RDI,0x180);
    for (local_28 = 0; local_28 < history_len; local_28 = local_28 + 1) {
      fprintf(__stream,"%s\n",*(undefined8 *)(history + local_28 * 8));
    }
    fclose(__stream);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int History::Save(const char *filename) {
	mode_t old_umask = umask(S_IXUSR | S_IRWXG | S_IRWXO);
	FILE *fp;

	fp = fopen(filename, "w");
	umask(old_umask);
	if (fp == nullptr) {
		return -1;
	}
	chmod(filename, S_IRUSR | S_IWUSR);
	for (idx_t j = 0; j < history_len; j++) {
		fprintf(fp, "%s\n", history[j]);
	}
	fclose(fp);
	return 0;
}